

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

bool __thiscall
crnlib::mipmapped_texture::read_crn(mipmapped_texture *this,data_stream_serializer *serializer)

{
  bool bVar1;
  undefined1 *puVar2;
  char *pFilename;
  vector<unsigned_char> crn_data;
  vector<unsigned_char> local_28;
  
  local_28.m_p = (uchar *)0x0;
  local_28.m_size = 0;
  local_28.m_capacity = 0;
  bVar1 = data_stream::read_array(serializer->m_pStream,&local_28);
  if (bVar1) {
    if (serializer->m_pStream == (data_stream *)0x0) {
      puVar2 = g_empty_dynamic_string;
    }
    else {
      puVar2 = (undefined1 *)&serializer->m_pStream->m_name;
    }
    pFilename = "";
    if (((dynamic_string *)puVar2)->m_pStr != (char *)0x0) {
      pFilename = ((dynamic_string *)puVar2)->m_pStr;
    }
    bVar1 = read_crn_from_memory(this,local_28.m_p,local_28.m_size,pFilename);
  }
  else {
    dynamic_string::set(&this->m_last_error,"Failed reading CRN file",0xffffffff);
    bVar1 = false;
  }
  if (local_28.m_p != (uchar *)0x0) {
    crnlib_free(local_28.m_p);
  }
  return bVar1;
}

Assistant:

bool mipmapped_texture::read_crn(data_stream_serializer& serializer) {
  crnlib::vector<uint8> crn_data;
  if (!serializer.read_entire_file(crn_data)) {
    set_last_error("Failed reading CRN file");
    return false;
  }
  return read_crn_from_memory(crn_data.get_ptr(), crn_data.size(), serializer.get_name().get_ptr());
}